

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O3

void ApprovalTests::CartesianProduct::Detail::
     for_each_impl<std::tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>,ApprovalTests::CartesianProduct::Detail::find_if_body<ApprovalTests::CartesianProduct::Detail::is_range_empty>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul>
               (long *t,long f)

{
  long lVar1;
  char cVar2;
  
  cVar2 = *(char *)(f + 0x18);
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[9] == ((long *)t[9])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[8] == ((long *)t[8])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[7] == ((long *)t[7])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[6] == ((long *)t[6])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[5] == ((long *)t[5])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[4] == ((long *)t[4])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[3] == ((long *)t[3])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[2] == ((long *)t[2])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)t[1] == ((long *)t[1])[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
      cVar2 = '\x01';
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  if (cVar2 == '\0') {
    lVar1 = *(long *)(f + 0x10);
    if (*(long *)*t == ((long *)*t)[1]) {
      **(long **)(f + 8) = lVar1;
      *(undefined1 *)(f + 0x18) = 1;
    }
    *(long *)(f + 0x10) = lVar1 + 1;
  }
  return;
}

Assistant:

void operator()(T&& value)
                {
                    if (found)
                        return;
                    if (pred(std::forward<T>(value)))
                    {
                        index = currentIndex;
                        found = true;
                    }
                    ++currentIndex;
                }